

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O2

bool Clasp::setOptLegacy(OptParams *out,uint32 n)

{
  uint uVar1;
  OptParams OVar2;
  uint uVar3;
  uint uVar4;
  
  if (n < 0x14) {
    uVar3 = 0;
    if (3 >= n) {
      uVar3 = n * 8;
    }
    OVar2 = (OptParams)(uVar3 | 3 < n | (uint)*out & 0x1f0e6);
    *out = OVar2;
    if ((3 < n) && (uVar3 = n - 4, uVar3 != 0)) {
      if ((n & 3) + (uVar3 & 4) != 0 || (uVar3 & 8) != 0) {
        uVar4 = (n & 3) << 8 | (uint)OVar2;
        uVar1 = uVar4 | 0x18;
        if ((uVar3 & 4) == 0) {
          uVar1 = uVar4;
        }
        *out = (OptParams)((uVar3 & 8) << 7 | uVar1);
      }
    }
  }
  return n < 0x14;
}

Assistant:

static bool setOptLegacy(OptParams& out, uint32 n) {
	if (n >= 20) { return false; }
	out.type = n < 4  ? OptParams::type_bb : OptParams::type_usc;
	out.algo = n < 4  ? n : 0;
	out.opts = 0u;
	out.kLim = 0u;
	if (n > 3 && (n -= 4u) != 0u) {
		if (test_bit(n, 0)) { out.opts |= OptParams::usc_disjoint; }
		if (test_bit(n, 1)) { out.opts |= OptParams::usc_succinct; }
		if (test_bit(n, 2)) { out.algo = OptParams::usc_pmr; }
		if (test_bit(n, 3)) { out.opts |= OptParams::usc_stratify; }
	}
	return true;
}